

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_hdr_id2int(bcf_hdr_t *h,int which,char *id)

{
  kh_vdict_t *h_00;
  khint_t kVar1;
  int local_34;
  vdict_t *d;
  khint_t k;
  char *id_local;
  int which_local;
  bcf_hdr_t *h_local;
  
  h_00 = (kh_vdict_t *)h->dict[which];
  kVar1 = kh_get_vdict(h_00,id);
  if (kVar1 == h_00->n_buckets) {
    local_34 = -1;
  }
  else {
    local_34 = h_00->vals[kVar1].id;
  }
  return local_34;
}

Assistant:

int bcf_hdr_id2int(const bcf_hdr_t *h, int which, const char *id)
{
    khint_t k;
    vdict_t *d = (vdict_t*)h->dict[which];
    k = kh_get(vdict, d, id);
    return k == kh_end(d)? -1 : kh_val(d, k).id;
}